

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretFlow.c
# Opt level: O3

int dfsplain_e(Abc_Obj_t *pObj,Abc_Obj_t *pPred)

{
  Abc_Obj_t *pAVar1;
  int iVar2;
  int iVar3;
  MinRegMan_t *pMVar4;
  uint uVar5;
  ulong uVar6;
  Vec_Ptr_t *pVVar7;
  long lVar8;
  
  uVar5 = *(uint *)(pManMR->pDataArray + (uint)pObj->Id);
  if (((pManMR->constraintMask & uVar5 & 0x90) == 0) && ((*(uint *)&pObj->field_0x14 & 0xf) != 2)) {
    *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) = (ushort)uVar5 | 1;
    pMVar4 = pManMR;
    if (pManMR->fIsForward == 0) {
      iVar2 = (pObj->vFanins).nSize;
      if (0 < iVar2) {
        lVar8 = 0;
        do {
          pAVar1 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar8]];
          if ((undefined1  [24])
              ((undefined1  [24])pMVar4->pDataArray[(uint)pAVar1->Id] & (undefined1  [24])0x2) ==
              (undefined1  [24])0x0) {
            iVar2 = dfsplain_r(pAVar1,pPred);
            if (iVar2 != 0) goto LAB_0047e7b3;
            iVar2 = (pObj->vFanins).nSize;
            pMVar4 = pManMR;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < iVar2);
      }
    }
    else {
      iVar2 = (pObj->vFanouts).nSize;
      if (0 < iVar2) {
        lVar8 = 0;
        do {
          pAVar1 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar8]];
          if ((undefined1  [24])
              ((undefined1  [24])pMVar4->pDataArray[(uint)pAVar1->Id] & (undefined1  [24])0x2) ==
              (undefined1  [24])0x0) {
            iVar2 = dfsplain_r(pAVar1,pPred);
            if (iVar2 != 0) goto LAB_0047e7b3;
            iVar2 = (pObj->vFanouts).nSize;
            pMVar4 = pManMR;
          }
          lVar8 = lVar8 + 1;
        } while (lVar8 < iVar2);
      }
    }
    iVar2 = 0;
    if ((*(uint *)&pObj->field_0x14 & 0xf) != 8) {
      if (pMVar4->fIsForward == 0) {
        iVar2 = (pObj->vFanouts).nSize;
        if (0 < iVar2) {
          lVar8 = 0;
          do {
            pAVar1 = (Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanouts).pArray[lVar8]];
            if ((undefined1  [24])
                ((undefined1  [24])pMVar4->pDataArray[(uint)pAVar1->Id] & (undefined1  [24])0x1) ==
                (undefined1  [24])0x0) {
              iVar2 = dfsplain_e(pAVar1,pPred);
              if (iVar2 != 0) goto LAB_0047e7b3;
              iVar2 = (pObj->vFanouts).nSize;
              pMVar4 = pManMR;
            }
            lVar8 = lVar8 + 1;
          } while (lVar8 < iVar2);
        }
        uVar5 = pObj->Id;
        uVar6 = (ulong)uVar5;
        if (pMVar4->maxDelay != 0) {
          if (0 < pMVar4->vTimeEdges[uVar6].nSize) {
            pVVar7 = pMVar4->vTimeEdges + uVar6;
            lVar8 = 0;
            do {
              if ((undefined1  [24])
                  ((undefined1  [24])
                   pMVar4->pDataArray[(uint)((Abc_Obj_t *)pVVar7->pArray[lVar8])->Id] &
                  (undefined1  [24])0x1) == (undefined1  [24])0x0) {
                iVar2 = dfsplain_e((Abc_Obj_t *)pVVar7->pArray[lVar8],pPred);
                if (iVar2 != 0) goto LAB_0047e7b3;
                uVar6 = (ulong)(uint)pObj->Id;
                pMVar4 = pManMR;
              }
              lVar8 = lVar8 + 1;
              uVar5 = (uint)uVar6;
              pVVar7 = pMVar4->vTimeEdges + uVar6;
            } while (lVar8 < pMVar4->vTimeEdges[uVar6].nSize);
          }
        }
      }
      else {
        uVar5 = pObj->Id;
      }
      iVar2 = 0;
      if (((undefined1  [24])((undefined1  [24])pMVar4->pDataArray[uVar5] & (undefined1  [24])0x6)
           == (undefined1  [24])0x4) &&
         (iVar3 = dfsplain_r(pObj,pMVar4->pDataArray[uVar5].field_1.pred), iVar3 != 0)) {
        *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) =
             *(ushort *)(pManMR->pDataArray + (uint)pObj->Id) & 0xfffb;
        FSETPRED(pObj,(Abc_Obj_t *)0x0);
LAB_0047e7b3:
        iVar2 = 1;
      }
    }
  }
  else {
    if (pPred == (Abc_Obj_t *)0x0) {
      __assert_fail("pPred",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretFlow.c"
                    ,0x216,"int dfsplain_e(Abc_Obj_t *, Abc_Obj_t *)");
    }
    iVar2 = 1;
    if (pManMR->fIsForward != 0) {
      __assert_fail("!pManMR->fIsForward",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/opt/fret/fretFlow.c"
                    ,0x217,"int dfsplain_e(Abc_Obj_t *, Abc_Obj_t *)");
    }
  }
  return iVar2;
}

Assistant:

int dfsplain_e( Abc_Obj_t *pObj, Abc_Obj_t *pPred ) {
  int i;
  Abc_Obj_t *pNext;
  
  if (FTEST(pObj, BLOCK_OR_CONS) & pManMR->constraintMask || 
      Abc_ObjIsPi(pObj)) {
    assert(pPred);
    assert(!pManMR->fIsForward);
    return 1;
  }

  FSET(pObj, VISITED_E);
  
  // printf(" %de\n", Abc_ObjId(pObj));
  
  // 1. structural edges
  if (pManMR->fIsForward)
    Abc_ObjForEachFanout( pObj, pNext, i ) {
      if (!FTEST(pNext, VISITED_R) &&
          dfsplain_r(pNext, pPred)) {
#ifdef DEBUG_PRINT_FLOWS
        printf("o");
#endif
        goto found;
      }
    }
  else
    Abc_ObjForEachFanin( pObj, pNext, i ) {
      if (!FTEST(pNext, VISITED_R) &&
          dfsplain_r(pNext, pPred)) {
#ifdef DEBUG_PRINT_FLOWS
        printf("o");
#endif
        goto found;
      }
    }
  
  if (Abc_ObjIsLatch(pObj))
    return 0;

  // 2. reverse edges (backward retiming only)
  if (!pManMR->fIsForward) {
    Abc_ObjForEachFanout( pObj, pNext, i ) {
      if (!FTEST(pNext, VISITED_E) &&
          dfsplain_e(pNext, pPred)) {
#ifdef DEBUG_PRINT_FLOWS
        printf("i");
#endif
        goto found;
      }
    }

  // 3. timing edges (backward retiming only)
#if !defined(IGNORE_TIMING)
    if (pManMR->maxDelay) 
      Vec_PtrForEachEntry(Abc_Obj_t*, FTIMEEDGES(pObj), pNext, i) {
        if (!FTEST(pNext, VISITED_E) &&
            dfsplain_e(pNext, pPred)) {
#ifdef DEBUG_PRINT_FLOWS
          printf("o");
#endif
          goto found;
        }
      }
#endif
  }
  
  // unwind
  if (FTEST(pObj, FLOW) && 
      !FTEST(pObj, VISITED_R) &&
      dfsplain_r(pObj, FGETPRED(pObj))) {
    FUNSET(pObj, FLOW);
    FSETPRED(pObj, NULL);
#ifdef DEBUG_PRINT_FLOWS
    printf("u");
#endif
    goto found;
  }
  
  return 0;
  
 found:
#ifdef DEBUG_PRINT_FLOWS
  printf("%d ", Abc_ObjId(pObj));
#endif

  return 1;
}